

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DTDElementDecl::addAttDef(DTDElementDecl *this,DTDAttDef *toAdd)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  DTDAttDefList *this_00;
  DTDAttDef **__dest;
  XMLSize_t XVar3;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_01;
  undefined4 extraout_var_00;
  
  this_01 = this->fAttDefs;
  if (this_01 == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    faultInAttDefList(this);
    this_01 = this->fAttDefs;
  }
  toAdd->fElemId = (this->super_XMLElementDecl).fId;
  iVar2 = (*(toAdd->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(toAdd);
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
            (this_01,(void *)CONCAT44(extraout_var,iVar2),toAdd);
  this_00 = this->fAttList;
  if (this_00 == (DTDAttDefList *)0x0) {
    this_00 = (DTDAttDefList *)
              XMemory::operator_new(0x38,(this->super_XMLElementDecl).fMemoryManager);
    DTDAttDefList::DTDAttDefList(this_00,this->fAttDefs,(this->super_XMLElementDecl).fMemoryManager)
    ;
    this->fAttList = this_00;
  }
  XVar3 = this_00->fCount;
  if (XVar3 == this_00->fSize) {
    this_00->fSize = XVar3 * 2;
    pMVar1 = (this_00->super_XMLAttDefList).fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar3 << 4);
    __dest = (DTDAttDef **)CONCAT44(extraout_var_00,iVar2);
    memcpy(__dest,this_00->fArray,this_00->fCount << 3);
    pMVar1 = (this_00->super_XMLAttDefList).fMemoryManager;
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this_00->fArray);
    this_00->fArray = __dest;
    XVar3 = this_00->fCount;
  }
  else {
    __dest = this_00->fArray;
  }
  this_00->fCount = XVar3 + 1;
  __dest[XVar3] = toAdd;
  return;
}

Assistant:

void DTDElementDecl::addAttDef(DTDAttDef* const toAdd)
{
    // Fault in the att list if required
    if (!fAttDefs)
            faultInAttDefList();

    // Tell this guy the element id of its parent (us)
    toAdd->setElemId(getId());

    fAttDefs->put((void*)(toAdd->getFullName()), toAdd);
    // update and/or create fAttList
    if(!fAttList)
        ((DTDElementDecl*)this)->fAttList = new (getMemoryManager()) DTDAttDefList(fAttDefs,getMemoryManager());
    fAttList->addAttDef(toAdd);
}